

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::ReverseTextureCoordinates(ON_Mesh *this,int dir)

{
  bool bVar1;
  bool bVar2;
  ON_2fPoint *pOVar3;
  float *pfVar4;
  double dVar5;
  bool local_59;
  ON_2fPoint *tc_1;
  ON_2fPoint *tc;
  double s;
  ON_Interval tex_dom;
  int i;
  int vcount;
  bool bSrfParamTag;
  bool bPackedRegion;
  int dir_local;
  ON_Mesh *this_local;
  
  if (((dir < 0) || (1 < dir)) || (bVar1 = HasTextureCoordinates(this), !bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = HasPackedTextureRegion(this);
    bVar2 = ON_MappingTag::IsSet(&this->m_Ttag);
    local_59 = true;
    if (bVar2) {
      local_59 = ON_MappingTag::IsDefaultSurfaceParameterMapping(&this->m_Ttag);
    }
    tex_dom.m_t[1]._4_4_ =
         ON_SimpleArray<ON_2fPoint>::Count(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
    if ((bVar1) && (local_59 != false)) {
      vcount = dir;
      if ((this->m_packed_tex_rotate & 1U) != 0) {
        vcount = 1 - dir;
      }
      s = this->m_srf_scale[(long)vcount * 2 + 2];
      tex_dom.m_t[0] = (this->m_srf_scale + (long)vcount * 2 + 2)[1];
      ON_Interval::Swap((ON_Interval *)(this->m_srf_scale + (long)vcount * 2 + 2));
      for (tex_dom.m_t[1]._0_4_ = 0; tex_dom.m_t[1]._0_4_ < tex_dom.m_t[1]._4_4_;
          tex_dom.m_t[1]._0_4_ = tex_dom.m_t[1]._0_4_ + 1) {
        pOVar3 = ON_SimpleArray<ON_2fPoint>::operator[]
                           (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,tex_dom.m_t[1]._0_4_);
        pfVar4 = ON_2fPoint::operator[](pOVar3,vcount);
        dVar5 = ON_Interval::NormalizedParameterAt((ON_Interval *)&s,(double)*pfVar4);
        if (vcount == 0) {
          dVar5 = ON_Interval::ParameterAt((ON_Interval *)&s,1.0 - dVar5);
          pOVar3->x = (float)dVar5;
        }
        else {
          dVar5 = ON_Interval::ParameterAt((ON_Interval *)&s,1.0 - dVar5);
          pOVar3->y = (float)dVar5;
        }
      }
    }
    else {
      for (tex_dom.m_t[1]._0_4_ = 0; tex_dom.m_t[1]._0_4_ < tex_dom.m_t[1]._4_4_;
          tex_dom.m_t[1]._0_4_ = tex_dom.m_t[1]._0_4_ + 1) {
        pOVar3 = ON_SimpleArray<ON_2fPoint>::operator[]
                           (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,tex_dom.m_t[1]._0_4_);
        if (dir == 0) {
          pOVar3->x = 1.0 - pOVar3->x;
        }
        else {
          pOVar3->y = 1.0 - pOVar3->y;
        }
      }
    }
    InvalidateCachedTextureCoordinates(this,false);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Mesh::ReverseTextureCoordinates( int dir )
{
  if ( dir < 0 || dir > 1 || !HasTextureCoordinates() )
    return false;

  bool bPackedRegion =  HasPackedTextureRegion();

  bool bSrfParamTag = (!m_Ttag.IsSet() || m_Ttag.IsDefaultSurfaceParameterMapping());

  const int vcount = m_T.Count();
  int i;
  if ( bPackedRegion && bSrfParamTag )
  {
    // The region of the bitmap the texture uses 
    // cannot change.  The texture coordinates 
    // themselves get reflected in the subrectangle
    // about either the lowerleft to upperright
    // diagonal (llur = true) or the lowerright
    // to upperleft diagonal (llur = false).
    if ( m_packed_tex_rotate )
      dir = 1-dir;
    const ON_Interval tex_dom = m_packed_tex_domain[dir];
    double s;
    m_packed_tex_domain[dir].Swap(); // Swap() is correct - Reverse() is wrong.
    for (i = 0; i < vcount; i++ )
    {
      ON_2fPoint& tc = m_T[i];
      s = 1.0 - tex_dom.NormalizedParameterAt(tc[dir]);
      if ( dir )
        tc.y = (float)tex_dom.ParameterAt(s);
      else
        tc.x = (float)tex_dom.ParameterAt(s);
    }
  }
  else
  {
    for (i = 0; i < vcount; i++ )
    {
      ON_2fPoint& tc = m_T[i];
      if ( dir )
        tc.y = 1.0f-tc.y;
      else
        tc.x = 1.0f-tc.x;
    }
  }
  // 12 Jan 2024 - Jeff: https://mcneel.myjetbrains.com/youtrack/issue/RH-79611
  InvalidateCachedTextureCoordinates();
  return true;
}